

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::PixelBufferAccess::setPixStencil(PixelBufferAccess *this,int stencil,int x,int y,int z)

{
  ChannelType CVar1;
  uchar uVar2;
  deUint8 *dst;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  int stencil_local;
  PixelBufferAccess *this_local;
  
  dst = (deUint8 *)getPixelPtr(this,x,y,z);
  CVar1 = (this->super_ConstPixelBufferAccess).m_format.type;
  if (CVar1 - UNSIGNED_INT_16_8_8 < 2) {
    uVar2 = (anonymous_namespace)::convertSat<unsigned_char,unsigned_int>(stencil);
    anon_unknown_75::writeUint32Low8(dst,uVar2);
  }
  else if (CVar1 == UNSIGNED_INT_24_8_REV) {
    uVar2 = (anonymous_namespace)::convertSat<unsigned_char,unsigned_int>(stencil);
    anon_unknown_75::writeUint32High8(dst,uVar2);
  }
  else if (CVar1 == FLOAT_UNSIGNED_INT_24_8_REV) {
    uVar2 = (anonymous_namespace)::convertSat<unsigned_char,unsigned_int>(stencil);
    anon_unknown_75::writeUint32Low8(dst + 4,uVar2);
  }
  else {
    anon_unknown_75::intToChannel(dst,stencil,(this->super_ConstPixelBufferAccess).m_format.type);
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixStencil (int stencil, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_16_8_8:
		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32Low8(pixelPtr, convertSat<deUint8>((deUint32)stencil));
			break;

		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32High8(pixelPtr, convertSat<deUint8>((deUint32)stencil));
			break;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32Low8(pixelPtr + 4, convertSat<deUint8>((deUint32)stencil));
			break;

		default:
			DE_ASSERT(m_format.order == TextureFormat::S);  // no other combined depth stencil types
			intToChannel(pixelPtr, stencil, m_format.type);
			break;
	}
}